

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::~cmMakefile(cmMakefile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  pointer ppcVar4;
  pointer ppcVar5;
  pointer ppcVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  pointer ppcVar9;
  pointer ppcVar10;
  char *pcVar11;
  pointer puVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar13;
  pointer ppcVar14;
  pointer ppcVar15;
  pointer ppcVar16;
  pointer ppcVar17;
  pointer ppcVar18;
  pointer ppcVar19;
  DefaultDeleter<std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>,_false>
  local_21;
  
  ppcVar2 = (this->InstallGenerators).
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar15 = (this->InstallGenerators).
                  super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar15 != ppcVar2;
      ppcVar15 = ppcVar15 + 1) {
    if (*ppcVar15 != (cmInstallGenerator *)0x0) {
      (*((*ppcVar15)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
    }
  }
  ppcVar3 = (this->TestGenerators).
            super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar16 = (this->TestGenerators).
                  super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppcVar16 != ppcVar3; ppcVar16 = ppcVar16 + 1) {
    if (*ppcVar16 != (cmTestGenerator *)0x0) {
      (*((*ppcVar16)->super_cmScriptGenerator)._vptr_cmScriptGenerator[1])();
    }
  }
  std::
  for_each<__gnu_cxx::__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>,false>>
            ((this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::
  for_each<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,cmTest*>>,ContainerAlgorithms::DefaultDeleter<std::map<std::__cxx11::string,cmTest*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTest*>>>,true>>
            ((this->Tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &(this->Tests)._M_t._M_impl.super__Rb_tree_header);
  std::
  for_each<__gnu_cxx::__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmTarget*,std::allocator<cmTarget*>>,false>>
            ((this->ImportedTargetsOwned).
             super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->ImportedTargetsOwned).
             super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  ppcVar4 = (this->FinalPassCommands).super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar17 = (this->FinalPassCommands).
                  super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppcVar17 != ppcVar4; ppcVar17 = ppcVar17 + 1) {
    if (*ppcVar17 != (cmCommand *)0x0) {
      (*(*ppcVar17)->_vptr_cmCommand[1])();
    }
  }
  ppcVar5 = (this->FunctionBlockers).
            super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppcVar18 = (this->FunctionBlockers).
                  super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppcVar18 != ppcVar5;
      ppcVar18 = ppcVar18 + 1) {
    if (*ppcVar18 != (cmFunctionBlocker *)0x0) {
      (*(*ppcVar18)->_vptr_cmFunctionBlocker[3])();
    }
  }
  ppcVar19 = (this->EvaluationFiles).
             super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppcVar6 = (this->EvaluationFiles).
            super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppcVar19 != ppcVar6) {
    do {
      ContainerAlgorithms::
      DefaultDeleter<std::vector<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>,_false>
      ::operator()(&local_21,*ppcVar19);
      ppcVar19 = ppcVar19 + 1;
    } while (ppcVar19 != ppcVar6);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->WarnedCMP0074)._M_t);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->OutputToSource)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->ImportedTargets)._M_h);
  ppcVar7 = (this->ImportedTargetsOwned).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar7 != (pointer)0x0) {
    operator_delete(ppcVar7,(long)(this->ImportedTargetsOwned).
                                  super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar7)
    ;
  }
  ppcVar8 = (this->ExecutionStatusStack).
            super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppcVar8 != (pointer)0x0) {
    operator_delete(ppcVar8,(long)(this->ExecutionStatusStack).
                                  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar8
                   );
  }
  ppcVar19 = (this->EvaluationFiles).
             super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar19 != (pointer)0x0) {
    operator_delete(ppcVar19,(long)(this->EvaluationFiles).
                                   super__Vector_base<cmGeneratorExpressionEvaluationFile_*,_std::allocator<cmGeneratorExpressionEvaluationFile_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppcVar19);
  }
  ppcVar9 = (this->ExportBuildFileGenerators).
            super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar9 != (pointer)0x0) {
    operator_delete(ppcVar9,(long)(this->ExportBuildFileGenerators).
                                  super__Vector_base<cmExportBuildFileGenerator_*,_std::allocator<cmExportBuildFileGenerator_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppcVar9
                   );
  }
  ppcVar10 = (this->UnConfiguredDirectories).
             super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar10 != (pointer)0x0) {
    operator_delete(ppcVar10,(long)(this->UnConfiguredDirectories).
                                   super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppcVar10);
  }
  pcVar11 = (this->cmNamedCurly).program;
  if (pcVar11 != (char *)0x0) {
    operator_delete__(pcVar11);
  }
  pcVar11 = (this->cmAtVarRegex).program;
  if (pcVar11 != (char *)0x0) {
    operator_delete__(pcVar11);
  }
  pcVar11 = (this->cmDefine01Regex).program;
  if (pcVar11 != (char *)0x0) {
    operator_delete__(pcVar11);
  }
  pcVar11 = (this->cmDefineRegex).program;
  if (pcVar11 != (char *)0x0) {
    operator_delete__(pcVar11);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&this->LoopBlockCounter);
  puVar12 = (this->FunctionBlockerBarriers).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (puVar12 != (pointer)0x0) {
    operator_delete(puVar12,(long)(this->FunctionBlockerBarriers).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar12)
    ;
  }
  ppcVar18 = (this->FunctionBlockers).
             super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar18 != (pointer)0x0) {
    operator_delete(ppcVar18,(long)(this->FunctionBlockers).
                                   super__Vector_base<cmFunctionBlocker_*,_std::allocator<cmFunctionBlocker_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppcVar18);
  }
  this_00 = (this->Backtrace).TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ppcVar17 = (this->FinalPassCommands).super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar17 != (pointer)0x0) {
    operator_delete(ppcVar17,(long)(this->FinalPassCommands).
                                   super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppcVar17);
  }
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&this->SourceGroups);
  pcVar13 = (this->DefineFlagsOrig)._M_dataplus._M_p;
  paVar1 = &(this->DefineFlagsOrig).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar13 != paVar1) {
    operator_delete(pcVar13,paVar1->_M_allocated_capacity + 1);
  }
  pcVar13 = (this->DefineFlags)._M_dataplus._M_p;
  paVar1 = &(this->DefineFlags).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar13 != paVar1) {
    operator_delete(pcVar13,paVar1->_M_allocated_capacity + 1);
  }
  pcVar13 = (this->ComplainFileRegularExpression)._M_dataplus._M_p;
  paVar1 = &(this->ComplainFileRegularExpression).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar13 != paVar1) {
    operator_delete(pcVar13,paVar1->_M_allocated_capacity + 1);
  }
  ppcVar16 = (this->TestGenerators).
             super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppcVar16 != (pointer)0x0) {
    operator_delete(ppcVar16,(long)(this->TestGenerators).
                                   super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppcVar16);
  }
  ppcVar15 = (this->InstallGenerators).
             super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  if (ppcVar15 != (pointer)0x0) {
    operator_delete(ppcVar15,(long)(this->InstallGenerators).
                                   super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppcVar15);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->OutputFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ListFiles);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->SystemIncludeDirectories)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTest_*>_>_>
  ::~_Rb_tree(&(this->Tests)._M_t);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->KnownFileSearchIndex)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->SourceFileSearchIndex)._M_h);
  ppcVar14 = (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar14 != (pointer)0x0) {
    operator_delete(ppcVar14,(long)(this->SourceFiles).
                                   super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage -
                             (long)ppcVar14);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->AliasTargets)._M_t);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->Targets)._M_h);
  std::
  _Rb_tree<cmListFileContext,_cmListFileContext,_std::_Identity<cmListFileContext>,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>
  ::~_Rb_tree(&(this->CMP0054ReportedIds)._M_t);
  std::
  deque<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~deque(&this->FindPackageRootPathStack);
  return;
}

Assistant:

cmMakefile::~cmMakefile()
{
  cmDeleteAll(this->InstallGenerators);
  cmDeleteAll(this->TestGenerators);
  cmDeleteAll(this->SourceFiles);
  cmDeleteAll(this->Tests);
  cmDeleteAll(this->ImportedTargetsOwned);
  cmDeleteAll(this->FinalPassCommands);
  cmDeleteAll(this->FunctionBlockers);
  cmDeleteAll(this->EvaluationFiles);
}